

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O0

void __thiscall markdown::token::Container::writeAsHtml(Container *this,ostream *out)

{
  bool bVar1;
  reference this_00;
  type pTVar2;
  _Self local_28;
  CTokenGroupIter ie;
  CTokenGroupIter i;
  ostream *out_local;
  Container *this_local;
  
  (*(this->super_Token)._vptr_Token[0x10])(this,out);
  ie._M_node = (_List_node_base *)
               std::__cxx11::
               list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
               ::begin(&this->mSubTokens);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
       ::end(&this->mSubTokens);
  while( true ) {
    bVar1 = std::operator!=(&ie,&local_28);
    if (!bVar1) break;
    this_00 = std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator*(&ie);
    pTVar2 = boost::shared_ptr<markdown::Token>::operator->(this_00);
    (*pTVar2->_vptr_Token[2])(pTVar2,out);
    std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator++(&ie);
  }
  (*(this->super_Token)._vptr_Token[0x11])(this,out);
  return;
}

Assistant:

void Container::writeAsHtml(std::ostream& out) const {
	preWrite(out);
	for (CTokenGroupIter i=mSubTokens.begin(), ie=mSubTokens.end(); i!=ie; ++i)
		(*i)->writeAsHtml(out);
	postWrite(out);
}